

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

double extract_spR<PredictionData<double,long>,long>
                 (PredictionData<double,_long> *prediction_data,long *row_st,long *row_end,
                 size_t col_num,size_t lb,size_t ub)

{
  size_t *psVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (col_num <= ub && (lb <= col_num && row_end != row_st)) {
    psVar1 = (size_t *)
             std::__lower_bound<long_const*,long,__gnu_cxx::__ops::_Iter_less_val>(row_st,row_end);
    if (psVar1 == (size_t *)row_end) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = 0.0;
      if (*psVar1 == col_num) {
        dVar2 = *(double *)
                 ((long)prediction_data->Xr + ((long)psVar1 - (long)prediction_data->Xr_ind));
      }
    }
  }
  return dVar2;
}

Assistant:

static inline double extract_spR(const PredictionData &prediction_data,
                                 const sparse_ix *row_st, const sparse_ix *row_end,
                                 size_t col_num, size_t lb, size_t ub) noexcept
{
    if (row_end == row_st || col_num < lb || col_num > ub)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}